

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void mi_option_init(mi_option_desc_t *desc)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  long *in_RDI;
  _Bool overflow;
  size_t size;
  long value;
  char *end;
  size_t i;
  size_t len;
  _Bool found;
  char buf [65];
  char s [65];
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  ulong local_c0;
  ulong local_b8;
  byte local_a9;
  char local_a8 [80];
  char local_58 [56];
  
  _mi_strlcpy(local_a8,"mimalloc_",0x41);
  _mi_strlcat((char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  local_a9 = _mi_getenv(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff08);
  if ((!(bool)local_a9) && (in_RDI[3] != 0)) {
    _mi_strlcpy(local_a8,"mimalloc_",0x41);
    _mi_strlcat((char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    local_a9 = _mi_getenv(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
    if ((bool)local_a9) {
      _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n"
                          ,in_RDI[3],in_RDI[2]);
    }
  }
  if ((local_a9 & 1) == 0) {
    _Var2 = _mi_preloading();
    if (!_Var2) {
      *(undefined4 *)(in_RDI + 1) = 1;
    }
  }
  else {
    local_b8 = _mi_strnlen(local_58,0x40);
    for (local_c0 = 0; local_c0 < local_b8; local_c0 = local_c0 + 1) {
      cVar1 = _mi_toupper(local_58[local_c0]);
      local_a8[local_c0] = cVar1;
    }
    local_a8[local_b8] = '\0';
    if ((local_a8[0] == '\0') || (pcVar3 = strstr("1;TRUE;YES;ON",local_a8), pcVar3 != (char *)0x0))
    {
      *in_RDI = 1;
      *(undefined4 *)(in_RDI + 1) = 2;
    }
    else {
      pcVar3 = strstr("0;FALSE;NO;OFF",local_a8);
      if (pcVar3 == (char *)0x0) {
        local_c8 = local_a8;
        local_d0 = (char *)strtol(local_a8,&local_c8,10);
        _Var2 = mi_option_has_size_in_kib(*(mi_option_t *)((long)in_RDI + 0xc));
        if (_Var2) {
          local_d8 = local_d0;
          if ((long)local_d0 < 0) {
            local_d8 = (char *)0x0;
          }
          _Var2 = false;
          if (*local_c8 == 'K') {
            local_c8 = local_c8 + 1;
          }
          else if (*local_c8 == 'M') {
            _Var2 = mi_mul_overflow((size_t)local_d8,0x400,(size_t *)&local_d8);
            local_c8 = local_c8 + 1;
          }
          else if (*local_c8 == 'G') {
            _Var2 = mi_mul_overflow((size_t)local_d8,0x100000,(size_t *)&local_d8);
            local_c8 = local_c8 + 1;
          }
          else if (*local_c8 == 'T') {
            _Var2 = mi_mul_overflow((size_t)local_d8,0x40000000,(size_t *)&local_d8);
            local_c8 = local_c8 + 1;
          }
          else {
            local_d8 = (char *)((ulong)(local_d8 + 0x3ff) >> 10);
          }
          if ((*local_c8 == 'I') && (local_c8[1] == 'B')) {
            local_c8 = local_c8 + 2;
          }
          else if (*local_c8 == 'B') {
            local_c8 = local_c8 + 1;
          }
          if ((_Var2 != false) || ((char *)0xfffffffe0000 < local_d8)) {
            local_d8 = (char *)0x3fffffff80;
          }
          in_stack_ffffffffffffff10 = local_d8;
          local_d0 = local_d8;
          if ((char *)0x7fffffffffffffff < local_d8) {
            local_d0 = (char *)0x7fffffffffffffff;
            in_stack_ffffffffffffff10 = local_d0;
          }
        }
        if (*local_c8 == '\0') {
          mi_option_set((mi_option_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                        in_stack_ffffffffffffff08);
        }
        else {
          *(undefined4 *)(in_RDI + 1) = 1;
          if ((*(int *)((long)in_RDI + 0xc) == 2) && (*in_RDI == 0)) {
            *in_RDI = 1;
            _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",in_RDI[2]);
            *in_RDI = 0;
          }
          else {
            _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",in_RDI[2]);
          }
        }
      }
      else {
        *in_RDI = 0;
        *(undefined4 *)(in_RDI + 1) = 2;
      }
    }
  }
  return;
}

Assistant:

static void mi_option_init(mi_option_desc_t* desc) {
  // Read option value from the environment
  char s[64 + 1];
  char buf[64+1];
  _mi_strlcpy(buf, "mimalloc_", sizeof(buf));
  _mi_strlcat(buf, desc->name, sizeof(buf));
  bool found = _mi_getenv(buf, s, sizeof(s));
  if (!found && desc->legacy_name != NULL) {
    _mi_strlcpy(buf, "mimalloc_", sizeof(buf));
    _mi_strlcat(buf, desc->legacy_name, sizeof(buf));
    found = _mi_getenv(buf, s, sizeof(s));
    if (found) {
      _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n", desc->legacy_name, desc->name);
    }
  }

  if (found) {
    size_t len = _mi_strnlen(s, sizeof(buf) - 1);
    for (size_t i = 0; i < len; i++) {
      buf[i] = _mi_toupper(s[i]);
    }
    buf[len] = 0;
    if (buf[0] == 0 || strstr("1;TRUE;YES;ON", buf) != NULL) {
      desc->value = 1;
      desc->init = INITIALIZED;
    }
    else if (strstr("0;FALSE;NO;OFF", buf) != NULL) {
      desc->value = 0;
      desc->init = INITIALIZED;
    }
    else {
      char* end = buf;
      long value = strtol(buf, &end, 10);
      if (mi_option_has_size_in_kib(desc->option)) {
        // this option is interpreted in KiB to prevent overflow of `long` for large allocations
        // (long is 32-bit on 64-bit windows, which allows for 4TiB max.)
        size_t size = (value < 0 ? 0 : (size_t)value);
        bool overflow = false;
        if (*end == 'K') { end++; }
        else if (*end == 'M') { overflow = mi_mul_overflow(size,MI_KiB,&size); end++; }
        else if (*end == 'G') { overflow = mi_mul_overflow(size,MI_MiB,&size); end++; }
        else if (*end == 'T') { overflow = mi_mul_overflow(size,MI_GiB,&size); end++; }
        else { size = (size + MI_KiB - 1) / MI_KiB; }
        if (end[0] == 'I' && end[1] == 'B') { end += 2; } // KiB, MiB, GiB, TiB
        else if (*end == 'B') { end++; }                  // Kb, Mb, Gb, Tb
        if (overflow || size > MI_MAX_ALLOC_SIZE) { size = (MI_MAX_ALLOC_SIZE / MI_KiB); }
        value = (size > LONG_MAX ? LONG_MAX : (long)size);
      }
      if (*end == 0) {
        mi_option_set(desc->option, value);
      }
      else {
        // set `init` first to avoid recursion through _mi_warning_message on mimalloc_verbose.
        desc->init = DEFAULTED;
        if (desc->option == mi_option_verbose && desc->value == 0) {
          // if the 'mimalloc_verbose' env var has a bogus value we'd never know
          // (since the value defaults to 'off') so in that case briefly enable verbose
          desc->value = 1;
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n", desc->name);
          desc->value = 0;
        }
        else {
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n", desc->name);
        }
      }
    }
    mi_assert_internal(desc->init != UNINIT);
  }
  else if (!_mi_preloading()) {
    desc->init = DEFAULTED;
  }
}